

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O2

void flatbuffers::java::GenStructBody(StructDef *struct_def,string *code_ptr,char *nameprefix)

{
  FieldDef *in;
  StructDef *struct_def_00;
  pointer ppFVar1;
  FieldDef *extraout_RDX;
  FieldDef *field;
  FieldDef *extraout_RDX_00;
  FieldDef *extraout_RDX_01;
  FieldDef *extraout_RDX_02;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  char *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58 = nameprefix;
  NumToString<unsigned_long>(&local_98,struct_def->minalign);
  std::operator+(&local_50,"    builder.prep(",&local_98);
  std::operator+(&local_78,&local_50,", 0);\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_98);
  ppFVar1 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  field = extraout_RDX;
  while (ppFVar1 !=
         (struct_def->fields).vec.
         super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
         _M_impl.super__Vector_impl_data._M_start) {
    in = ppFVar1[-1];
    if (in->padding != 0) {
      NumToString<unsigned_long>(&local_98,in->padding);
      std::operator+(&local_50,"    builder.pad(",&local_98);
      std::operator+(&local_78,&local_50,");\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_98);
      field = extraout_RDX_00;
    }
    ppFVar1 = ppFVar1 + -1;
    if (((in->value).type.base_type == BASE_TYPE_STRUCT) &&
       (struct_def_00 = (in->value).type.struct_def, struct_def_00->fixed == true)) {
      std::operator+(&local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     struct_def_00,"_");
      GenStructBody(struct_def_00,code_ptr,local_78._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_78);
      field = extraout_RDX_01;
    }
    else {
      GenMethod_abi_cxx11_(&local_98,(java *)in,field);
      std::operator+(&local_50,"    builder.put",&local_98);
      std::operator+(&local_78,&local_50,"(");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_98);
      MakeCamel(&local_98,(string *)in,false);
      std::operator+(&local_50,local_58,&local_98);
      std::operator+(&local_78,&local_50,");\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_98);
      field = extraout_RDX_02;
    }
  }
  return;
}

Assistant:

static void GenStructBody(const StructDef &struct_def, std::string *code_ptr,
                          const char *nameprefix) {
  std::string &code = *code_ptr;
  code += "    builder.prep(" + NumToString(struct_def.minalign) + ", 0);\n";
  for (auto it = struct_def.fields.vec.rbegin();
       it != struct_def.fields.vec.rend();
       ++it) {
    auto &field = **it;
    if (field.padding)
      code += "    builder.pad(" + NumToString(field.padding) + ");\n";
    if (IsStruct(field.value.type)) {
      GenStructBody(*field.value.type.struct_def, code_ptr,
                    (field.value.type.struct_def->name + "_").c_str());
    } else {
      code += "    builder.put" + GenMethod(field) + "(";
      code += nameprefix + MakeCamel(field.name, false) + ");\n";
    }
  }
}